

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O2

void __thiscall
agge::tests::GenericRGBXBlenderTests::PixelComponentsAreSetAccordinglyToOrderOnCopy
          (GenericRGBXBlenderTests *this)

{
  pixel1 pVar1;
  color cVar2;
  color cVar3;
  allocator local_61;
  pixel2 dest2;
  pixel1 dest1;
  pixel2 reference2;
  pixel1 reference1;
  string local_50;
  LocationInfo local_30;
  
  dest1.components[0] = '\0';
  dest1.components[1] = '\0';
  dest1.components[2] = '\0';
  dest1.components[3] = '\0';
  dest2.components[0] = '\0';
  dest2.components[1] = '\0';
  dest2.components[2] = '\0';
  dest2.components[3] = '\0';
  cVar2 = color::make('\x01','\x02','\x03',0xff);
  cVar3 = color::make('\x11','\x12','\x13',0xff);
  pVar1 = dest1;
  dest1.components[1] = cVar2.g;
  dest1.components[0] = cVar2.b;
  dest1.components[3] = pVar1.components[3];
  dest1.components[2] = cVar2.r;
  dest2.components[1] = cVar3.r;
  dest2.components[2] = cVar3.g;
  dest2.components[3] = cVar3.b;
  builtin_memcpy(reference1.components,"\x03\x02\x01",4);
  reference2.components[0] = '\0';
  reference2.components[1] = '\x11';
  reference2.components[2] = '\x12';
  reference2.components[3] = '\x13';
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x13b);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_bgra>,agge::tests::mocks::pixel_rgbx<agge::order_bgra>>
            (&reference1,&dest1,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x13c);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_argb>,agge::tests::mocks::pixel_rgbx<agge::order_argb>>
            (&reference2,&dest2,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( PixelComponentsAreSetAccordinglyToOrderOnCopy )
			{
				typedef mocks::pixel_rgbx<order_bgra> pixel1;
				typedef mocks::pixel_rgbx<order_argb> pixel2;

				// INIT
				pixel1 dest1 = { };
				pixel2 dest2 = { };
				blender_solid_color_rgb<pixel1, order_bgra> b1(color::make(0x01, 0x02, 0x03));
				blender_solid_color_rgb<pixel2, order_argb> b2(color::make(0x11, 0x12, 0x13));

				// ACT
				b1(&dest1, 0, 0, 1);
				b2(&dest2, 0, 0, 1);

				// ASSERT
				pixel1 reference1 = { { 0x03, 0x02, 0x01, } };
				pixel2 reference2 = { { 0, 0x11, 0x12, 0x13, } };

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
			}